

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int pack_particle_slice(field3d<cellp> *cp,int left,int width,
                       vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t p_index;
  size_t pn_index;
  size_t local_60;
  long local_58;
  field3d<cellp> *local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  local_38 = 0;
  local_60 = 0;
  if (0 < width) {
    lVar2 = (long)left;
    local_58 = (long)(width + left);
    local_50 = cp;
    do {
      if (0 < ny_global) {
        local_40 = 0;
        local_48 = lVar2;
        do {
          if (0 < nz_global) {
            lVar3 = 0;
            lVar1 = 0;
            do {
              pack_cell((cellp *)((long)&((cp->p)._M_t.
                                          super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                          .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                          [lVar2][local_40]->pl).head + lVar3),particle_numbers,
                        &local_38,particles,&local_60);
              lVar1 = lVar1 + 1;
              lVar3 = lVar3 + 0x10;
              lVar2 = local_48;
              cp = local_50;
            } while (lVar1 < nz_global);
          }
          local_40 = local_40 + 1;
        } while (local_40 < ny_global);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < local_58);
  }
  return (int)local_60;
}

Assistant:

int pack_particle_slice(field3d<cellp> & cp, int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(cp[i][j][k], particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}